

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int diff(double *sig,int N,int d,double *oup)

{
  double *C;
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  lVar6 = (long)d;
  C = (double *)malloc(lVar6 * 8 + 8);
  deld(d,C);
  uVar1 = 0;
  if (0 < d) {
    uVar1 = (ulong)(uint)d;
  }
  pdVar2 = sig + lVar6 + -1;
  for (lVar3 = lVar6; lVar3 < N; lVar3 = lVar3 + 1) {
    dVar7 = 0.0;
    pdVar4 = pdVar2;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      dVar7 = dVar7 + *pdVar4 * C[uVar5 + 1];
      pdVar4 = pdVar4 + -1;
    }
    oup[lVar3 - lVar6] = *C * sig[lVar3] + dVar7;
    pdVar2 = pdVar2 + 1;
  }
  free(C);
  return N - d;
}

Assistant:

int diff(double *sig, int N, int d, double *oup) {
	int Noup,i,j;
	double *coeff;
	double sum;
	/*
	 * 
	 * diff output = [ X(t) - X(t-1) ] ^ d where X(t) is the
	 * input timeseries of length N
	 * output is of length N - d
	 * 
	 * diff is used to detrend data
	 * 
	 * d=1 typically takes care of linear trend while
	 * d=2 handles quadratic trend
	 */ 
	
	coeff = (double*) malloc(sizeof(double) * (d+1));
	deld(d,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = 1; j < d+1;++j) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}

	free(coeff);
	
	
	return Noup;
}